

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void __thiscall
cxxopts::option_not_present_exception::~option_not_present_exception
          (option_not_present_exception *this)

{
  OptionException::~OptionException((OptionException *)this);
  operator_delete(this,0x28);
  return;
}

Assistant:

option_not_present_exception(const std::string& option)
    : OptionParseException("Option " + LQUOTE + option + RQUOTE + " not present")
    {
    }